

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_style_set_font(nk_context *ctx,nk_user_font *font)

{
  nk_style *style;
  nk_user_font *font_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3986,"void nk_style_set_font(struct nk_context *, const struct nk_user_font *)"
                 );
  }
  if (ctx != (nk_context *)0x0) {
    (ctx->style).font = font;
    (ctx->stacks).fonts.head = 0;
    if (ctx->current != (nk_window *)0x0) {
      nk_layout_reset_min_row_height(ctx);
    }
  }
  return;
}

Assistant:

NK_API void
nk_style_set_font(struct nk_context *ctx, const struct nk_user_font *font)
{
    struct nk_style *style;
    NK_ASSERT(ctx);

    if (!ctx) return;
    style = &ctx->style;
    style->font = font;
    ctx->stacks.fonts.head = 0;
    if (ctx->current)
        nk_layout_reset_min_row_height(ctx);
}